

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# work_steal_queue.h
# Opt level: O0

task_run_handle __thiscall async::detail::work_steal_queue::steal(work_steal_queue *this)

{
  atomic<async::detail::work_steal_queue::circular_array_*> *paVar1;
  ptrdiff_t pVar2;
  __pointer_type this_00;
  void *ptr;
  __pointer_type pcVar3;
  atomic<async::detail::work_steal_queue::circular_array_*> *in_RSI;
  void *x;
  circular_array *a;
  size_t b;
  size_t t;
  work_steal_queue *this_local;
  __pointer_type local_68;
  memory_order local_60;
  int local_5c;
  memory_order __b_1;
  __pointer_type local_50;
  memory_order local_48;
  int local_44;
  memory_order __b;
  undefined4 local_38;
  undefined1 local_31;
  __pointer_type local_30;
  undefined4 local_28;
  undefined4 local_24;
  __pointer_type local_20;
  size_t *local_18;
  atomic<async::detail::work_steal_queue::circular_array_*> *local_10;
  
  pcVar3 = (__pointer_type)b;
  this_local = this;
  while( true ) {
    b = (size_t)pcVar3;
    paVar1 = in_RSI + 1;
    local_44 = 2;
    ___b = paVar1;
    local_48 = std::operator&(memory_order_acquire,__memory_order_mask);
    if (local_44 - 1U < 2) {
      local_50 = (paVar1->_M_b)._M_p;
    }
    else if (local_44 == 5) {
      local_50 = (paVar1->_M_b)._M_p;
    }
    else {
      local_50 = (paVar1->_M_b)._M_p;
    }
    b = (size_t)local_50;
    local_38 = 5;
    paVar1 = in_RSI + 2;
    local_5c = 2;
    ___b_1 = paVar1;
    local_60 = std::operator&(memory_order_acquire,__memory_order_mask);
    if (local_5c - 1U < 2) {
      local_68 = (paVar1->_M_b)._M_p;
    }
    else if (local_5c == 5) {
      local_68 = (paVar1->_M_b)._M_p;
    }
    else {
      local_68 = (paVar1->_M_b)._M_p;
    }
    pVar2 = to_signed((long)local_68 - b);
    if (pVar2 < 1) break;
    this_00 = std::atomic<async::detail::work_steal_queue::circular_array_*>::load
                        (in_RSI,memory_order_consume);
    ptr = circular_array::get(this_00,b);
    local_10 = in_RSI + 1;
    local_30 = (__pointer_type)(b + 1);
    local_18 = &b;
    local_24 = 5;
    local_28 = 0;
    LOCK();
    pcVar3 = (local_10->_M_b)._M_p;
    local_31 = (__pointer_type)b == pcVar3;
    if ((bool)local_31) {
      (local_10->_M_b)._M_p = local_30;
      pcVar3 = (__pointer_type)b;
    }
    UNLOCK();
    local_20 = local_30;
    if ((bool)local_31) {
      task_run_handle::from_void_ptr((task_run_handle *)this,ptr);
      return (task_run_handle)(task_ptr)this;
    }
  }
  memset(this,0,8);
  task_run_handle::task_run_handle((task_run_handle *)this);
  return (task_run_handle)(task_ptr)this;
}

Assistant:

task_run_handle steal()
	{
		// Loop while the compare_exchange fails. This is still lock-free because
		// a fail means that another thread has sucessfully stolen a task.
		while (true) {
			// Make sure top is read before bottom
			std::size_t t = top.load(std::memory_order_acquire);
			std::atomic_thread_fence(std::memory_order_seq_cst);
			std::size_t b = bottom.load(std::memory_order_acquire);

			// Exit if the queue is empty
			if (to_signed(b - t) <= 0)
				return task_run_handle();

			// Fetch the element from the queue
			circular_array* a = array.load(std::memory_order_consume);
			void* x = a->get(t);

			// Attempt to increment top
			if (top.compare_exchange_weak(t, t + 1, std::memory_order_seq_cst, std::memory_order_relaxed))
				return task_run_handle::from_void_ptr(x);
		}
	}